

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O2

ParameterError str2udouble(double *valp,char *str,long max)

{
  int *piVar1;
  size_t sVar2;
  ParameterError PVar3;
  double dVar4;
  char *endptr;
  
  PVar3 = PARAM_BAD_NUMERIC;
  if (str != (char *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0;
    dVar4 = strtod(str,&endptr);
    if ((*piVar1 == 0x22) || ((double)max < dVar4)) {
      PVar3 = PARAM_NUMBER_TOO_LARGE;
    }
    else if ((endptr != str) && (sVar2 = strlen(str), endptr == str + sVar2)) {
      if (0.0 <= dVar4) {
        *valp = dVar4;
        PVar3 = PARAM_OK;
      }
      else {
        PVar3 = PARAM_NEGATIVE_NUMERIC;
      }
    }
  }
  return PVar3;
}

Assistant:

ParameterError str2udouble(double *valp, const char *str, long max)
{
  double value;
  ParameterError result = str2double(&value, str, max);
  if(result != PARAM_OK)
    return result;
  if(value < 0)
    return PARAM_NEGATIVE_NUMERIC;

  *valp = value;
  return PARAM_OK;
}